

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O2

void SstReaderInitFFSCallback
               (SstStream Stream,void *Reader,VarSetupUpcallFunc VarCallback,
               ArraySetupUpcallFunc ArrayCallback,MinArraySetupUpcallFunc MinArrayCallback,
               AttrSetupUpcallFunc AttrCallback,ArrayBlocksInfoUpcallFunc BlocksInfoCallback)

{
  Stream->VarSetupUpcall = VarCallback;
  Stream->ArraySetupUpcall = ArrayCallback;
  Stream->MinArraySetupUpcall = MinArrayCallback;
  Stream->AttrSetupUpcall = AttrCallback;
  Stream->ArrayBlocksInfoUpcall = BlocksInfoCallback;
  Stream->SetupUpcallReader = Reader;
  return;
}

Assistant:

void NO_SANITIZE_THREAD SstReaderInitFFSCallback(SstStream Stream, void *Reader,
                                                 VarSetupUpcallFunc VarCallback,
                                                 ArraySetupUpcallFunc ArrayCallback,
                                                 MinArraySetupUpcallFunc MinArrayCallback,
                                                 AttrSetupUpcallFunc AttrCallback,
                                                 ArrayBlocksInfoUpcallFunc BlocksInfoCallback)
{
    Stream->VarSetupUpcall = VarCallback;
    Stream->ArraySetupUpcall = ArrayCallback;
    Stream->MinArraySetupUpcall = MinArrayCallback;
    Stream->AttrSetupUpcall = AttrCallback;
    Stream->ArrayBlocksInfoUpcall = BlocksInfoCallback;
    Stream->SetupUpcallReader = Reader;
}